

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O0

void __thiscall cmQtAutoGeneratorMocUic::SettingsFileRead(cmQtAutoGeneratorMocUic *this)

{
  bool bVar1;
  MocSettingsT *pMVar2;
  BaseSettingsT *pBVar3;
  UicSettingsT *pUVar4;
  FileSystem *pFVar5;
  char *pcVar6;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [8];
  string content;
  string local_158;
  reference local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *item;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range2;
  undefined1 local_f8 [8];
  string str_1;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  string str;
  allocator<char> local_41;
  string local_40 [8];
  string sep;
  cmCryptoHash crypt;
  cmQtAutoGeneratorMocUic *this_local;
  
  cmCryptoHash::cmCryptoHash((cmCryptoHash *)((long)&sep.field_2 + 8),AlgoSHA256);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40," ~~~ ",&local_41);
  std::allocator<char>::~allocator(&local_41);
  if (((this->Moc_).Enabled & 1U) != 0) {
    std::__cxx11::string::string((string *)local_78);
    pMVar2 = Moc(this);
    std::__cxx11::string::operator+=((string *)local_78,(string *)&pMVar2->Executable);
    std::__cxx11::string::operator+=((string *)local_78,local_40);
    pMVar2 = Moc(this);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_98,&pMVar2->AllOptions,";");
    std::__cxx11::string::operator+=((string *)local_78,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::operator+=((string *)local_78,local_40);
    pBVar3 = Base(this);
    pcVar6 = "FALSE";
    if ((pBVar3->IncludeProjectDirsBefore & 1U) != 0) {
      pcVar6 = "TRUE";
    }
    std::__cxx11::string::operator+=((string *)local_78,pcVar6);
    std::__cxx11::string::operator+=((string *)local_78,local_40);
    pMVar2 = Moc(this);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_b8,&pMVar2->PredefsCmd,";");
    std::__cxx11::string::operator+=((string *)local_78,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::operator+=((string *)local_78,local_40);
    cmCryptoHash::HashString
              ((string *)((long)&str_1.field_2 + 8),(cmCryptoHash *)((long)&sep.field_2 + 8),
               (string *)local_78);
    std::__cxx11::string::operator=
              ((string *)&this->SettingsStringMoc_,(string *)(str_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(str_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_78);
  }
  pUVar4 = Uic(this);
  if ((pUVar4->Enabled & 1U) != 0) {
    std::__cxx11::string::string((string *)local_f8);
    pUVar4 = Uic(this);
    std::__cxx11::string::operator+=((string *)local_f8,(string *)&pUVar4->Executable);
    std::__cxx11::string::operator+=((string *)local_f8,local_40);
    pUVar4 = Uic(this);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)&__range2,&pUVar4->TargetOptions,";");
    std::__cxx11::string::operator+=((string *)local_f8,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    pUVar4 = Uic(this);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::begin(&pUVar4->Options);
    item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::end(&pUVar4->Options);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&item), bVar1) {
      local_138 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator*(&__end2);
      std::__cxx11::string::operator+=((string *)local_f8,local_40);
      std::__cxx11::string::operator+=((string *)local_f8,(string *)local_138);
      std::__cxx11::string::operator+=((string *)local_f8,local_40);
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_158,&local_138->second,";");
      std::__cxx11::string::operator+=((string *)local_f8,(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::operator+=((string *)local_f8,local_40);
    cmCryptoHash::HashString
              ((string *)((long)&content.field_2 + 8),(cmCryptoHash *)((long)&sep.field_2 + 8),
               (string *)local_f8);
    std::__cxx11::string::operator=
              ((string *)&this->SettingsStringUic_,(string *)(content.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(content.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_f8);
  }
  std::__cxx11::string::~string(local_40);
  cmCryptoHash::~cmCryptoHash((cmCryptoHash *)((long)&sep.field_2 + 8));
  std::__cxx11::string::string((string *)local_198);
  pFVar5 = cmQtAutoGenerator::FileSys(&this->super_cmQtAutoGenerator);
  bVar1 = cmQtAutoGenerator::FileSystem::FileRead
                    (pFVar5,(string *)local_198,&this->SettingsFile_,(string *)0x0);
  if (bVar1) {
    pMVar2 = Moc(this);
    if ((pMVar2->Enabled & 1U) != 0) {
      cmQtAutoGenerator::SettingsFind(&local_1b8,(string *)local_198,"moc");
      bVar1 = std::operator!=(&this->SettingsStringMoc_,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      if (bVar1) {
        (this->Moc_).SettingsChanged = true;
      }
    }
    pUVar4 = Uic(this);
    if ((pUVar4->Enabled & 1U) != 0) {
      cmQtAutoGenerator::SettingsFind(&local_1d8,(string *)local_198,"uic");
      bVar1 = std::operator!=(&this->SettingsStringUic_,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      if (bVar1) {
        (this->Uic_).SettingsChanged = true;
      }
    }
    pMVar2 = Moc(this);
    if (((pMVar2->SettingsChanged & 1U) != 0) ||
       (pUVar4 = Uic(this), (pUVar4->SettingsChanged & 1U) != 0)) {
      pFVar5 = cmQtAutoGenerator::FileSys(&this->super_cmQtAutoGenerator);
      cmQtAutoGenerator::FileSystem::FileRemove(pFVar5,&this->SettingsFile_);
    }
  }
  else {
    pMVar2 = Moc(this);
    if ((pMVar2->Enabled & 1U) != 0) {
      (this->Moc_).SettingsChanged = true;
    }
    pUVar4 = Uic(this);
    if ((pUVar4->Enabled & 1U) != 0) {
      (this->Uic_).SettingsChanged = true;
    }
  }
  std::__cxx11::string::~string((string *)local_198);
  return;
}

Assistant:

void cmQtAutoGeneratorMocUic::SettingsFileRead()
{
  // Compose current settings strings
  {
    cmCryptoHash crypt(cmCryptoHash::AlgoSHA256);
    std::string const sep(" ~~~ ");
    if (Moc_.Enabled) {
      std::string str;
      str += Moc().Executable;
      str += sep;
      str += cmJoin(Moc().AllOptions, ";");
      str += sep;
      str += Base().IncludeProjectDirsBefore ? "TRUE" : "FALSE";
      str += sep;
      str += cmJoin(Moc().PredefsCmd, ";");
      str += sep;
      SettingsStringMoc_ = crypt.HashString(str);
    }
    if (Uic().Enabled) {
      std::string str;
      str += Uic().Executable;
      str += sep;
      str += cmJoin(Uic().TargetOptions, ";");
      for (const auto& item : Uic().Options) {
        str += sep;
        str += item.first;
        str += sep;
        str += cmJoin(item.second, ";");
      }
      str += sep;
      SettingsStringUic_ = crypt.HashString(str);
    }
  }

  // Read old settings and compare
  {
    std::string content;
    if (FileSys().FileRead(content, SettingsFile_)) {
      if (Moc().Enabled) {
        if (SettingsStringMoc_ != SettingsFind(content, "moc")) {
          Moc_.SettingsChanged = true;
        }
      }
      if (Uic().Enabled) {
        if (SettingsStringUic_ != SettingsFind(content, "uic")) {
          Uic_.SettingsChanged = true;
        }
      }
      // In case any setting changed remove the old settings file.
      // This triggers a full rebuild on the next run if the current
      // build is aborted before writing the current settings in the end.
      if (Moc().SettingsChanged || Uic().SettingsChanged) {
        FileSys().FileRemove(SettingsFile_);
      }
    } else {
      // Settings file read failed
      if (Moc().Enabled) {
        Moc_.SettingsChanged = true;
      }
      if (Uic().Enabled) {
        Uic_.SettingsChanged = true;
      }
    }
  }
}